

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::ToolButton::paintEvent(ToolButton *this,QPaintEvent *param_1)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int w;
  int h;
  ToolButtonPrivate *pTVar8;
  undefined1 auVar9 [16];
  QPainter local_70 [8];
  QPainter p;
  QSize s;
  QRect r;
  QPixmap local_48 [8];
  QPixmap pixmap;
  QIcon local_20 [8];
  QPaintEvent *local_18;
  QPaintEvent *param_1_local;
  ToolButton *this_local;
  
  local_18 = param_1;
  param_1_local = (QPaintEvent *)this;
  QScopedPointer<QtMWidgets::ToolButtonPrivate,_QScopedPointerDeleter<QtMWidgets::ToolButtonPrivate>_>
  ::operator->(&this->d);
  QAction::icon();
  bVar1 = QIcon::isNull();
  QIcon::~QIcon(local_20);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    QScopedPointer<QtMWidgets::ToolButtonPrivate,_QScopedPointerDeleter<QtMWidgets::ToolButtonPrivate>_>
    ::operator->(&this->d);
    QAction::icon();
    pTVar8 = QScopedPointer<QtMWidgets::ToolButtonPrivate,_QScopedPointerDeleter<QtMWidgets::ToolButtonPrivate>_>
             ::operator->(&this->d);
    QIcon::pixmap(local_48,&r.x2,&pTVar8->iconSize,0,1);
    QIcon::~QIcon((QIcon *)&r.x2);
    auVar9 = QWidget::contentsRect();
    r._0_8_ = auVar9._8_8_;
    s = auVar9._0_8_;
    _p = (QSize)QPixmap::size();
    QPainter::QPainter(local_70,(QPaintDevice *)&this->field_0x10);
    iVar2 = QRect::left((QRect *)&s);
    iVar3 = QRect::width((QRect *)&s);
    iVar4 = QSize::width((QSize *)&p);
    iVar5 = QRect::top((QRect *)&s);
    iVar6 = QRect::height((QRect *)&s);
    iVar7 = QSize::height((QSize *)&p);
    w = QSize::width((QSize *)&p);
    h = QSize::height((QSize *)&p);
    QPainter::drawPixmap
              (local_70,iVar2 + (iVar3 - iVar4) / 2,iVar5 + (iVar6 - iVar7) / 2,w,h,local_48);
    QPainter::~QPainter(local_70);
    QPixmap::~QPixmap(local_48);
  }
  return;
}

Assistant:

void
ToolButton::paintEvent( QPaintEvent * )
{
	if( !d->action->icon().isNull() )
	{
		const QPixmap pixmap = d->action->icon().pixmap( d->iconSize );
		const QRect r = contentsRect();
		const QSize s = pixmap.size();

		QPainter p( this );

		p.drawPixmap( r.left() + ( r.width() - s.width() ) / 2,
			r.top() + ( r.height() - s.height() ) / 2,
			s.width(), s.height(), pixmap );
	}
}